

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

void randomx::generateSuperscalar(SuperscalarProgram *prog,Blake2Generator *gen)

{
  uint32_t pc;
  uint uVar1;
  SuperscalarInstruction *pSVar2;
  bool bVar3;
  int iVar4;
  SuperscalarInstructionType SVar5;
  int iVar6;
  SuperscalarInstructionType SVar7;
  int iVar8;
  SuperscalarInstructionInfo *pSVar9;
  int *piVar10;
  undefined8 in_RSI;
  SuperscalarProgram *in_RDI;
  int i_1;
  int addressReg;
  int asicLatencyMax;
  int latSrc;
  int latDst;
  Instruction *instr;
  int i;
  double ipc;
  RegisterInfo *ri;
  int dst;
  int forward_1;
  int forward;
  int scheduleCycle;
  MacroOp *mop;
  int topCycle;
  int bufferIndex;
  int throwAwayCount;
  int decodeCycle;
  int mulCount;
  int programSize;
  bool portsSaturated;
  int retireCycle;
  int depCycle;
  int cycle;
  int macroOpCount;
  int codeSize;
  int macroOpIndex;
  SuperscalarInstruction currentInstruction;
  DecoderBuffer *decodeBuffer;
  RegisterInfo registers [8];
  type_conflict portBusy [174] [3];
  int in_stack_fffffffffffff628;
  int in_stack_fffffffffffff62c;
  undefined4 in_stack_fffffffffffff630;
  SuperscalarInstructionType in_stack_fffffffffffff634;
  int in_stack_fffffffffffff638;
  SuperscalarInstructionType in_stack_fffffffffffff63c;
  uint in_stack_fffffffffffff640;
  SuperscalarInstructionType in_stack_fffffffffffff644;
  uint in_stack_fffffffffffff648;
  undefined2 in_stack_fffffffffffff64c;
  undefined1 in_stack_fffffffffffff64e;
  undefined1 in_stack_fffffffffffff64f;
  undefined8 uVar11;
  Blake2Generator *gen_00;
  undefined4 in_stack_fffffffffffff670;
  uint in_stack_fffffffffffff674;
  SuperscalarInstruction *this;
  SuperscalarInstruction *local_978;
  int local_96c;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  Instruction *local_958;
  int local_94c;
  double local_948;
  SuperscalarInstructionInfo **local_940;
  int local_938;
  int local_934;
  int local_930;
  int local_92c;
  MacroOp *local_928;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  int local_90c;
  uint32_t local_908;
  byte local_901;
  int local_900;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  int local_8f0;
  SuperscalarInstructionType local_8ec;
  SuperscalarInstruction local_8e8;
  Blake2Generator *local_8c0;
  SuperscalarInstruction local_8b8 [3];
  SuperscalarInstruction local_838 [52];
  undefined8 local_10;
  SuperscalarProgram *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_838,0,0x828);
  this = local_838;
  pSVar2 = local_8b8;
  do {
    local_978 = pSVar2;
    RegisterInfo::RegisterInfo((RegisterInfo *)local_978);
    pSVar2 = (SuperscalarInstruction *)&local_978->mod_;
  } while ((SuperscalarInstruction *)&local_978->mod_ != this);
  local_8c0 = (Blake2Generator *)DecoderBuffer::Default;
  memcpy(&local_8e8,SuperscalarInstruction::Null,0x28);
  local_8ec = ISUB_R;
  local_8f0 = 0;
  local_8f4 = 0;
  local_8f8 = 0;
  local_8fc = 0;
  local_900 = 0;
  local_901 = 0;
  local_908 = 0;
  local_90c = 0;
  local_914 = 0;
  local_910 = 0;
LAB_0014de2c:
  uVar1 = in_stack_fffffffffffff674 & 0xffffff;
  if ((local_910 < 0xaa) && (uVar1 = in_stack_fffffffffffff674 & 0xffffff, (local_901 & 1) == 0)) {
    uVar1 = CONCAT13((int)local_908 < 0x200,(int3)in_stack_fffffffffffff674);
  }
  in_stack_fffffffffffff674 = uVar1;
  if ((char)(in_stack_fffffffffffff674 >> 0x18) == '\0') {
    local_948 = (double)local_8f4 / (double)local_900;
    memset(local_8->asicLatencies,0,0x20);
    for (local_94c = 0; local_94c < (int)local_908; local_94c = local_94c + 1) {
      local_958 = SuperscalarProgram::operator()(local_8,local_94c);
      local_95c = local_8->asicLatencies[local_958->dst] + 1;
      if (local_958->dst == local_958->src) {
        local_960 = 0;
      }
      else {
        local_960 = local_8->asicLatencies[local_958->src] + 1;
      }
      piVar10 = std::max<int>(&local_95c,&local_960);
      local_8->asicLatencies[local_958->dst] = *piVar10;
    }
    local_964 = 0;
    local_968 = 0;
    for (local_96c = 0; local_96c < 8; local_96c = local_96c + 1) {
      if (local_964 < local_8->asicLatencies[local_96c]) {
        local_964 = local_8->asicLatencies[local_96c];
        local_968 = local_96c;
      }
      local_8->cpuLatencies[local_96c] = *(int *)(&local_8b8[0].info_ + (long)local_96c * 2);
    }
    SuperscalarProgram::setSize(local_8,local_908);
    SuperscalarProgram::setAddressRegister(local_8,local_968);
    local_8->cpuLatency = local_900;
    local_8->asicLatency = local_964;
    local_8->codeSize = local_8f0;
    local_8->macroOps = local_8f4;
    local_8->decodeCycles = local_910;
    local_8->ipc = local_948;
    local_8->mulCount = local_90c;
    return;
  }
  gen_00 = local_8c0;
  SuperscalarInstruction::getType((SuperscalarInstruction *)0x14de88);
  local_8c0 = (Blake2Generator *)
              DecoderBuffer::fetchNext
                        ((DecoderBuffer *)
                         CONCAT17(in_stack_fffffffffffff64f,
                                  CONCAT16(in_stack_fffffffffffff64e,
                                           CONCAT24(in_stack_fffffffffffff64c,
                                                    in_stack_fffffffffffff648))),
                         in_stack_fffffffffffff644,in_stack_fffffffffffff640,
                         in_stack_fffffffffffff63c,
                         (Blake2Generator *)
                         CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
  local_918 = 0;
LAB_0014debd:
  do {
    iVar8 = local_918;
    iVar4 = DecoderBuffer::getSize((DecoderBuffer *)local_8c0);
    if (iVar4 <= iVar8) break;
    local_91c = local_8f8;
    SVar7 = local_8ec;
    SuperscalarInstruction::getInfo(&local_8e8);
    SVar5 = SuperscalarInstructionInfo::getSize((SuperscalarInstructionInfo *)0x14df11);
    if (SVar5 <= SVar7) {
      if (((local_901 & 1) != 0) || (0x1ff < (int)local_908)) break;
      uVar11 = local_10;
      piVar10 = DecoderBuffer::getCounts((DecoderBuffer *)local_8c0);
      iVar4 = piVar10[local_918];
      iVar6 = DecoderBuffer::getIndex((DecoderBuffer *)local_8c0);
      DecoderBuffer::getSize((DecoderBuffer *)local_8c0);
      SuperscalarInstruction::createForSlot
                ((SuperscalarInstruction *)CONCAT44(iVar8,SVar7),
                 (Blake2Generator *)CONCAT44(iVar6,iVar4),(int)((ulong)uVar11 >> 0x20),(int)uVar11,
                 (bool)in_stack_fffffffffffff64f,(bool)in_stack_fffffffffffff64e);
      local_8ec = ISUB_R;
    }
    SuperscalarInstruction::getInfo(&local_8e8);
    local_928 = SuperscalarInstructionInfo::getOp
                          ((SuperscalarInstructionInfo *)
                           CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                           in_stack_fffffffffffff62c);
    local_92c = scheduleMop<false>((MacroOp *)
                                   CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                                   (type_conflict (*) [174] [3])
                                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                   in_stack_fffffffffffff62c,in_stack_fffffffffffff628);
    if (local_92c < 0) {
      local_901 = 1;
      break;
    }
    in_stack_fffffffffffff64c = (undefined2)local_8ec;
    in_stack_fffffffffffff64e = (undefined1)((uint)local_8ec >> 0x10);
    in_stack_fffffffffffff64f = (undefined1)((uint)local_8ec >> 0x18);
    pSVar9 = SuperscalarInstruction::getInfo(&local_8e8);
    iVar4 = SuperscalarInstructionInfo::getSrcOp(pSVar9);
    if (CONCAT13(in_stack_fffffffffffff64f,
                 CONCAT12(in_stack_fffffffffffff64e,in_stack_fffffffffffff64c)) != iVar4) {
LAB_0014e152:
      in_stack_fffffffffffff644 = local_8ec;
      pSVar9 = SuperscalarInstruction::getInfo(&local_8e8);
      SVar7 = SuperscalarInstructionInfo::getDstOp(pSVar9);
      if (in_stack_fffffffffffff644 == SVar7) {
        local_934 = 0;
        while( true ) {
          in_stack_fffffffffffff640 = in_stack_fffffffffffff640 & 0xffffff;
          if (local_934 < 4) {
            bVar3 = SuperscalarInstruction::selectDestination
                              (this,(int)((ulong)local_978 >> 0x20),
                               SUB81((ulong)local_978 >> 0x18,0),
                               (RegisterInfo (*) [8])
                               CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),gen_00)
            ;
            in_stack_fffffffffffff640 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff640) ^ 0xff000000
            ;
          }
          if ((in_stack_fffffffffffff640 & 0x1000000) == 0) break;
          local_92c = local_92c + 1;
          local_8f8 = local_8f8 + 1;
          local_934 = local_934 + 1;
        }
        if (local_934 == 4) {
          if (0xff < local_914) {
            memcpy(&local_8e8,SuperscalarInstruction::Null,0x22);
            break;
          }
          local_914 = local_914 + 1;
          SuperscalarInstruction::getInfo(&local_8e8);
          local_8ec = SuperscalarInstructionInfo::getSize((SuperscalarInstructionInfo *)0x14e255);
          goto LAB_0014debd;
        }
      }
      local_914 = 0;
      iVar8 = scheduleMop<true>((MacroOp *)
                                CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                                (type_conflict (*) [174] [3])
                                CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                in_stack_fffffffffffff62c,in_stack_fffffffffffff628);
      local_92c = iVar8;
      if (iVar8 < 0) {
        local_901 = 1;
        break;
      }
      local_8fc = MacroOp::getLatency(local_928);
      local_8fc = iVar8 + local_8fc;
      in_stack_fffffffffffff63c = local_8ec;
      pSVar9 = SuperscalarInstruction::getInfo(&local_8e8);
      SVar7 = SuperscalarInstructionInfo::getResultOp(pSVar9);
      in_stack_fffffffffffff638 = iVar8;
      if (in_stack_fffffffffffff63c == SVar7) {
        local_938 = SuperscalarInstruction::getDestination(&local_8e8);
        local_940 = &local_8b8[0].info_ + (long)local_938 * 2;
        local_900 = local_8fc;
        *(int *)local_940 = local_8fc;
        SVar7 = SuperscalarInstruction::getGroup(&local_8e8);
        *(SuperscalarInstructionType *)((long)local_940 + 4) = SVar7;
        iVar4 = SuperscalarInstruction::getGroupPar(&local_8e8);
        *(int *)(local_940 + 1) = iVar4;
        in_stack_fffffffffffff638 = iVar8;
      }
      iVar8 = MacroOp::getSize(local_928);
      local_8f0 = iVar8 + local_8f0;
      local_918 = local_918 + 1;
      in_stack_fffffffffffff634 = local_8ec + IXOR_R;
      local_8f4 = local_8f4 + 1;
      if (0xa9 < local_92c) {
        local_901 = 1;
      }
      local_8f8 = local_91c;
      local_8ec = in_stack_fffffffffffff634;
      SuperscalarInstruction::getInfo(&local_8e8);
      SVar7 = SuperscalarInstructionInfo::getSize((SuperscalarInstructionInfo *)0x14e439);
      pc = local_908;
      if (SVar7 <= in_stack_fffffffffffff634) {
        local_908 = local_908 + 1;
        SuperscalarProgram::operator()(local_8,pc);
        SuperscalarInstruction::toInstr
                  ((SuperscalarInstruction *)
                   CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                   (Instruction *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
        SVar7 = SuperscalarInstruction::getType((SuperscalarInstruction *)0x14e480);
        bVar3 = isMultiplication(SVar7);
        local_90c = (uint)bVar3 + local_90c;
      }
      goto LAB_0014debd;
    }
    local_930 = 0;
    while( true ) {
      in_stack_fffffffffffff648 = in_stack_fffffffffffff648 & 0xffffff;
      if (local_930 < 4) {
        bVar3 = SuperscalarInstruction::selectSource
                          (local_978,in_stack_fffffffffffff674,(RegisterInfo (*) [8])gen_00,
                           (Blake2Generator *)CONCAT44(iVar8,SVar7));
        in_stack_fffffffffffff648 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff648) ^ 0xff000000;
      }
      if ((in_stack_fffffffffffff648 & 0x1000000) == 0) break;
      local_92c = local_92c + 1;
      local_8f8 = local_8f8 + 1;
      local_930 = local_930 + 1;
    }
    if (local_930 != 4) goto LAB_0014e152;
    if (0xff < local_914) {
      memcpy(&local_8e8,SuperscalarInstruction::Null,0x22);
      break;
    }
    local_914 = local_914 + 1;
    SuperscalarInstruction::getInfo(&local_8e8);
    local_8ec = SuperscalarInstructionInfo::getSize((SuperscalarInstructionInfo *)0x14e126);
  } while( true );
  local_8f8 = local_8f8 + 1;
  local_910 = local_910 + 1;
  goto LAB_0014de2c;
}

Assistant:

void generateSuperscalar(SuperscalarProgram& prog, Blake2Generator& gen) {

		ExecutionPort::type portBusy[CYCLE_MAP_SIZE][3];
		memset(portBusy, 0, sizeof(portBusy));
		RegisterInfo registers[8];

		const DecoderBuffer* decodeBuffer = &DecoderBuffer::Default;
		SuperscalarInstruction currentInstruction = SuperscalarInstruction::Null;
		int macroOpIndex = 0;
		int codeSize = 0;
		int macroOpCount = 0;
		int cycle = 0;
		int depCycle = 0;
		int retireCycle = 0;
		bool portsSaturated = false;
		int programSize = 0;
		int mulCount = 0;
		int decodeCycle;
		int throwAwayCount = 0;

		//decode instructions for RANDOMX_SUPERSCALAR_LATENCY cycles or until an execution port is saturated.
		//Each decode cycle decodes 16 bytes of x86 code.
		//Since a decode cycle produces on average 3.45 macro-ops and there are only 3 ALU ports, execution ports are always
		//saturated first. The cycle limit is present only to guarantee loop termination.
		//Program size is limited to SuperscalarMaxSize instructions.
		for (decodeCycle = 0; decodeCycle < RANDOMX_SUPERSCALAR_LATENCY && !portsSaturated && programSize < SuperscalarMaxSize; ++decodeCycle) {

			//select a decode configuration
			decodeBuffer = decodeBuffer->fetchNext(currentInstruction.getType(), decodeCycle, mulCount, gen);
			if (trace) std::cout << "; ------------- fetch cycle " << cycle << " (" << decodeBuffer->getName() << ")" << std::endl;

			int bufferIndex = 0;
			
			//fill all instruction slots in the current decode buffer
			while (bufferIndex < decodeBuffer->getSize()) {
				int topCycle = cycle;

				//if we have issued all macro-ops for the current RandomX instruction, create a new instruction
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					if (portsSaturated || programSize >= SuperscalarMaxSize)
						break;
					//select an instruction so that the first macro-op fits into the current slot
					currentInstruction.createForSlot(gen, decodeBuffer->getCounts()[bufferIndex], decodeBuffer->getIndex(), decodeBuffer->getSize() == bufferIndex + 1, bufferIndex == 0);
					macroOpIndex = 0;
					if (trace) std::cout << "; " << currentInstruction.getInfo().getName() << std::endl;
				}
				const MacroOp& mop = currentInstruction.getInfo().getOp(macroOpIndex);
				if (trace) std::cout << mop.getName() << " ";

				//calculate the earliest cycle when this macro-op (all of its uOPs) can be scheduled for execution
				int scheduleCycle = scheduleMop<false>(mop, portBusy, cycle, depCycle);
				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << cycle << ")" << std::endl;
					//__debugbreak();
					portsSaturated = true;
					break;
				}

				//find a source register (if applicable) that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getSrcOp()) {
					int forward;
					//if no suitable operand is ready, look up to LOOK_FORWARD_CYCLES forward
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectSource(scheduleCycle, registers, gen); ++forward) {
						if (trace) std::cout << "; src STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					//if no register was found, throw the instruction away and try another one
					if (forward == LOOK_FORWARD_CYCLES) {
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - source registers not available for operation " << currentInstruction.getInfo().getName() << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; src = r" << currentInstruction.getSource() << std::endl;
				}
				//find a destination register that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getDstOp()) {
					int forward;
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectDestination(scheduleCycle, throwAwayCount > 0, registers, gen); ++forward) {
						if (trace) std::cout << "; dst STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					if (forward == LOOK_FORWARD_CYCLES) { //throw instruction away
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - destination registers not available" << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; dst = r" << currentInstruction.getDestination() << std::endl;
				}
				throwAwayCount = 0;

				//recalculate when the instruction can be scheduled for execution based on operand availability
				scheduleCycle = scheduleMop<true>(mop, portBusy, scheduleCycle, scheduleCycle);

				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << scheduleCycle << ")" << std::endl;
					portsSaturated = true;
					break;
				}

				//calculate when the result will be ready
				depCycle = scheduleCycle + mop.getLatency();

				//if this instruction writes the result, modify register information
				//  RegisterInfo.latency - which cycle the register will be ready
				//  RegisterInfo.lastOpGroup - the last operation that was applied to the register
				//  RegisterInfo.lastOpPar - the last operation source value (-1 = constant, 0-7 = register)
				if (macroOpIndex == currentInstruction.getInfo().getResultOp()) {
					int dst = currentInstruction.getDestination();
					RegisterInfo& ri = registers[dst];
					retireCycle = depCycle;
					ri.latency = retireCycle;
					ri.lastOpGroup = currentInstruction.getGroup();
					ri.lastOpPar = currentInstruction.getGroupPar();
					if (trace) std::cout << "; RETIRED at cycle " << retireCycle << std::endl;
				}
				codeSize += mop.getSize();
				bufferIndex++;
				macroOpIndex++;
				macroOpCount++;

				//terminating condition
				if (scheduleCycle >= RANDOMX_SUPERSCALAR_LATENCY) {
					portsSaturated = true;
				}
				cycle = topCycle;

				//when all macro-ops of the current instruction have been issued, add the instruction into the program
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					currentInstruction.toInstr(prog(programSize++));
					mulCount += isMultiplication(currentInstruction.getType());
				}
			}
			++cycle;
		}

		double ipc = (macroOpCount / (double)retireCycle);

		memset(prog.asicLatencies, 0, sizeof(prog.asicLatencies));

		//Calculate ASIC latency:
		//Assumes 1 cycle latency for all operations and unlimited parallelization.
		for (int i = 0; i < programSize; ++i) {
			Instruction& instr = prog(i);
			int latDst = prog.asicLatencies[instr.dst] + 1;
			int latSrc = instr.dst != instr.src ? prog.asicLatencies[instr.src] + 1 : 0;
			prog.asicLatencies[instr.dst] = std::max(latDst, latSrc);
		}

		//address register is the register with the highest ASIC latency
		int asicLatencyMax = 0;
		int addressReg = 0;
		for (int i = 0; i < 8; ++i) {
			if (prog.asicLatencies[i] > asicLatencyMax) {
				asicLatencyMax = prog.asicLatencies[i];
				addressReg = i;
			}
			prog.cpuLatencies[i] = registers[i].latency;
		}

		prog.setSize(programSize);
		prog.setAddressRegister(addressReg);

		prog.cpuLatency = retireCycle;
		prog.asicLatency = asicLatencyMax;
		prog.codeSize = codeSize;
		prog.macroOps = macroOpCount;
		prog.decodeCycles = decodeCycle;
		prog.ipc = ipc;
		prog.mulCount = mulCount;
		

		/*if(INFO) std::cout << "; ALU port utilization:" << std::endl;
		if (INFO) std::cout << "; (* = in use, _ = idle)" << std::endl;

		int portCycles = 0;
		for (int i = 0; i < CYCLE_MAP_SIZE; ++i) {
			std::cout << "; " << std::setw(3) << i << " ";
			for (int j = 0; j < 3; ++j) {
				std::cout << (portBusy[i][j] ? '*' : '_');
				portCycles += !!portBusy[i][j];
			}
			std::cout << std::endl;
		}*/
	}